

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.hpp
# Opt level: O0

uint32_t chaiscript::utility::fnv1a::hash<char_const*>(char *begin,char *end)

{
  uint local_1c;
  uint32_t h;
  char *end_local;
  char *begin_local;
  
  local_1c = 0x811c9dc5;
  for (end_local = begin; end_local != end; end_local = end_local + 1) {
    local_1c = (local_1c ^ (int)*end_local) * 0x1000193;
  }
  return local_1c;
}

Assistant:

static constexpr std::uint32_t hash(Itr begin, Itr end) noexcept {
#ifdef __GNUC__
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wsign-conversion"
#endif

#ifdef CHAISCRIPT_MSVC
#pragma warning(push)
#pragma warning(disable : 4307)
#endif
        std::uint32_t h = 0x811c9dc5;

        while (begin != end) {
          h = (h ^ (*begin)) * 0x01000193;
          ++begin;
        }
        return h;

#ifdef CHAISCRIPT_MSVC
#pragma warning(pop)
#endif

#ifdef __GNUC__
#pragma GCC diagnostic pop
#endif
      }